

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ascii-parser.cc
# Opt level: O3

bool __thiscall tinyusdz::ascii::AsciiParser::ParseStageMetaOpt(AsciiParser *this)

{
  pointer pcVar1;
  storage_t<double> sVar2;
  _Rb_tree_node_base *p_Var3;
  pointer pcVar4;
  undefined8 uVar5;
  bool bVar6;
  bool bVar7;
  int iVar8;
  const_iterator cVar9;
  mapped_type *def;
  ostream *poVar10;
  undefined8 *puVar11;
  long *plVar12;
  float *pfVar13;
  const_iterator cVar14;
  storage_t<double> *psVar15;
  size_t *psVar16;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar17;
  undefined8 **ppuVar18;
  size_type *psVar19;
  undefined4 uVar20;
  long lVar21;
  byte bVar22;
  ostringstream oVar23;
  anon_struct_8_0_00000001_for___align aVar24;
  value_type *pvVar25;
  char *pcVar26;
  AssetPath *item;
  optional<tinyusdz::value::StringData> pv;
  optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_> pvs;
  string varname;
  string msg;
  StringData str;
  undefined1 local_2b8 [8];
  undefined1 local_2b0 [8];
  _Rb_tree_node_base local_2a8;
  size_t local_288;
  _Base_ptr local_280;
  undefined1 local_278 [32];
  undefined8 uStack_258;
  string local_248;
  string local_228;
  storage_union local_208;
  undefined8 *local_1f8;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paStack_1f0;
  undefined8 local_1e8;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_1e0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1d0;
  undefined1 local_1b0 [8];
  undefined1 local_1a8 [16];
  undefined1 local_198 [24];
  size_t local_180 [8];
  ios_base local_140 [264];
  anon_struct_8_0_00000001_for___align local_38;
  
  pcVar1 = local_1a8 + 8;
  local_1a8._0_8_ = (anon_struct_8_0_00000001_for___align)0x0;
  local_1a8._8_8_ = local_1a8._8_8_ & 0xffffffffffffff00;
  local_198[8] = false;
  local_198[9] = false;
  local_198._12_4_ = 0;
  local_198._16_4_ = 0;
  local_1b0 = (undefined1  [8])pcVar1;
  bVar6 = MaybeTripleQuotedString(this,(StringData *)local_1b0);
  if (bVar6) {
LAB_00322fee:
    ::std::__cxx11::string::_M_assign((string *)&(this->_stage_metas).comment);
    (this->_stage_metas).comment.line_col = local_198._16_4_;
    (this->_stage_metas).comment.is_triple_quoted = (bool)local_198[8];
    (this->_stage_metas).comment.single_quote = (bool)local_198[9];
    *(undefined2 *)&(this->_stage_metas).comment.field_0x22 = local_198._10_2_;
    (this->_stage_metas).comment.line_row = local_198._12_4_;
    bVar6 = false;
  }
  else {
    bVar7 = MaybeString(this,(StringData *)local_1b0);
    bVar6 = true;
    if (bVar7) goto LAB_00322fee;
  }
  if (local_1b0 != (undefined1  [8])pcVar1) {
    operator_delete((void *)local_1b0,(ulong)(local_1a8._8_8_ + 1));
  }
  if (!bVar6) {
    return true;
  }
  local_228._M_string_length = 0;
  local_228.field_2._M_local_buf[0] = '\0';
  local_228._M_dataplus._M_p = (pointer)&local_228.field_2;
  bVar6 = ReadIdentifier(this,&local_228);
  if (bVar6) {
    cVar9 = ::std::
            _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::ascii::AsciiParser::VariableDef>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::ascii::AsciiParser::VariableDef>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::ascii::AsciiParser::VariableDef>_>_>
            ::find(&(this->_supported_stage_metas)._M_t,&local_228);
    if ((_Rb_tree_header *)cVar9._M_node ==
        &(this->_supported_stage_metas)._M_t._M_impl.super__Rb_tree_header) {
      ::std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       local_1b0,"\'",
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       &local_228);
      puVar11 = (undefined8 *)::std::__cxx11::string::append((char *)local_1b0);
      ppuVar18 = (undefined8 **)(puVar11 + 2);
      if ((undefined8 **)*puVar11 == ppuVar18) {
        local_1f8 = *ppuVar18;
        paStack_1f0 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)puVar11[3];
        local_208.dynamic = &local_1f8;
      }
      else {
        local_1f8 = *ppuVar18;
        local_208.dynamic = (undefined8 **)*puVar11;
      }
      local_208._8_8_ = puVar11[1];
      *puVar11 = ppuVar18;
      puVar11[1] = 0;
      *(undefined1 *)(puVar11 + 2) = 0;
      if (local_1b0 != (undefined1  [8])pcVar1) {
        operator_delete((void *)local_1b0,(ulong)(local_1a8._8_8_ + 1));
      }
      ::std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1b0);
      ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1b0,"[error]",7);
      ::std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)local_1b0,
                 "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/ascii-parser.cc"
                 ,0x56);
      ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1b0,":",1);
      ::std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)local_1b0,"ParseStageMetaOpt",0x11);
      ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1b0,"():",3);
      poVar10 = (ostream *)::std::ostream::operator<<((ostringstream *)local_1b0,0x70d);
      ::std::__ostream_insert<char,std::char_traits<char>>(poVar10," ",1);
      poVar10 = ::std::__ostream_insert<char,std::char_traits<char>>
                          ((ostream *)local_1b0,(char *)local_208.dynamic,local_208._8_8_);
      ::std::__ostream_insert<char,std::char_traits<char>>(poVar10,"\n",1);
      ::std::__cxx11::stringbuf::str();
      PushError(this,(string *)local_2b8);
      if (local_2b8 != (undefined1  [8])&local_2a8) {
        operator_delete((void *)local_2b8,(ulong)(local_2a8._0_8_ + 1));
      }
      ::std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_1b0);
      ::std::ios_base::~ios_base(local_140);
      if ((undefined8 **)local_208.dynamic != &local_1f8) {
        operator_delete(local_208.dynamic,(long)local_1f8 + 1);
      }
    }
    else {
      bVar6 = Expect(this,'=');
      if (bVar6) {
        bVar6 = SkipWhitespace(this);
        if (bVar6) {
          def = ::std::
                map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::ascii::AsciiParser::VariableDef,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::ascii::AsciiParser::VariableDef>_>_>
                ::at(&this->_supported_stage_metas,&local_228);
          local_1f8 = &linb::any::vtable_for_type<decltype(nullptr)>()::table;
          pbVar17 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
          local_208.dynamic = (undefined8 **)0x0;
          local_1e8 = 0;
          local_1e0._M_local_buf[0] = '\0';
          paStack_1f0 = &local_1e0;
          bVar6 = ParseMetaValue(this,def,(MetaVariable *)&local_208);
          if (!bVar6) {
            ::std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1b0);
            ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1b0,"[error]",7);
            ::std::__ostream_insert<char,std::char_traits<char>>
                      ((ostream *)local_1b0,
                       "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/ascii-parser.cc"
                       ,0x56);
            ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1b0,":",1);
            ::std::__ostream_insert<char,std::char_traits<char>>
                      ((ostream *)local_1b0,"ParseStageMetaOpt",0x11);
            ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1b0,"():",3);
            poVar10 = (ostream *)::std::ostream::operator<<((ostringstream *)local_1b0,0x71d);
            ::std::__ostream_insert<char,std::char_traits<char>>(poVar10," ",1);
            pcVar26 = "Failed to parse meta value.\n";
            lVar21 = 0x1c;
            goto LAB_003237be;
          }
          ::std::__cxx11::string::_M_assign((string *)&paStack_1f0);
          iVar8 = ::std::__cxx11::string::compare((char *)&local_228);
          if (iVar8 == 0) {
            local_2b0 = (undefined1  [8])0x0;
            local_2a8._0_8_ = local_2a8._0_8_ & 0xffffffffffffff00;
            local_2b8 = (undefined1  [8])&local_2a8;
            bVar6 = MetaVariable::get_value<tinyusdz::Token>
                              ((MetaVariable *)&local_208,(Token *)local_2b8);
            if (bVar6) {
              ::std::__cxx11::string::_M_assign((string *)&(this->_stage_metas).defaultPrim);
            }
            else {
              ::std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1b0);
              ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1b0,"[error]",7)
              ;
              ::std::__ostream_insert<char,std::char_traits<char>>
                        ((ostream *)local_1b0,
                         "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/ascii-parser.cc"
                         ,0x56);
              ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1b0,":",1);
              ::std::__ostream_insert<char,std::char_traits<char>>
                        ((ostream *)local_1b0,"ParseStageMetaOpt",0x11);
              ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1b0,"():",3);
              poVar10 = (ostream *)::std::ostream::operator<<((ostringstream *)local_1b0,0x728);
              ::std::__ostream_insert<char,std::char_traits<char>>(poVar10," ",1);
              ::std::__ostream_insert<char,std::char_traits<char>>
                        ((ostream *)local_1b0,"`defaultPrim` isn\'t a token value.",0x22);
              ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1b0,"\n",1);
              ::std::__cxx11::stringbuf::str();
              PushError(this,(string *)local_278);
              if (local_278._0_8_ != (long)local_278 + 0x10) {
                operator_delete((void *)local_278._0_8_,(ulong)(local_278._16_8_ + 1));
              }
              ::std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_1b0);
              ::std::ios_base::~ios_base(local_140);
            }
            if (local_2b8 != (undefined1  [8])&local_2a8) {
              operator_delete((void *)local_2b8,(ulong)(local_2a8._0_8_ + 1));
            }
            if (bVar6) goto LAB_0032473d;
LAB_00323835:
            bVar6 = false;
          }
          else {
            iVar8 = ::std::__cxx11::string::compare((char *)&local_228);
            if (iVar8 == 0) {
              local_278._0_8_ = (anon_struct_8_0_00000001_for___align)0x0;
              local_278._8_8_ = (anon_struct_8_0_00000001_for___align)0x0;
              local_278._16_8_ = (value_type *)0x0;
              bVar6 = MetaVariable::
                      get_value<std::vector<tinyusdz::value::AssetPath,std::allocator<tinyusdz::value::AssetPath>>>
                                ((MetaVariable *)&local_208,
                                 (vector<tinyusdz::value::AssetPath,_std::allocator<tinyusdz::value::AssetPath>_>
                                  *)local_278);
              uVar5 = local_278._8_8_;
              if (!bVar6) {
                ::std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1b0);
                ::std::__ostream_insert<char,std::char_traits<char>>
                          ((ostream *)local_1b0,"[error]",7);
                ::std::__ostream_insert<char,std::char_traits<char>>
                          ((ostream *)local_1b0,
                           "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/ascii-parser.cc"
                           ,0x56);
                ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1b0,":",1);
                ::std::__ostream_insert<char,std::char_traits<char>>
                          ((ostream *)local_1b0,"ParseStageMetaOpt",0x11);
                ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1b0,"():",3);
                poVar10 = (ostream *)::std::ostream::operator<<((ostringstream *)local_1b0,0x732);
                ::std::__ostream_insert<char,std::char_traits<char>>(poVar10," ",1);
                ::std::__ostream_insert<char,std::char_traits<char>>
                          ((ostream *)local_1b0,"`subLayers` isn\'t an array of asset path",0x28);
                ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1b0,"\n",1);
                ::std::__cxx11::stringbuf::str();
                PushError(this,(string *)local_2b8);
                if (local_2b8 != (undefined1  [8])&local_2a8) {
                  operator_delete((void *)local_2b8,(ulong)(local_2a8._0_8_ + 1));
                }
                ::std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_1b0);
                ::std::ios_base::~ios_base(local_140);
                ::std::
                vector<tinyusdz::value::AssetPath,_std::allocator<tinyusdz::value::AssetPath>_>::
                ~vector((vector<tinyusdz::value::AssetPath,_std::allocator<tinyusdz::value::AssetPath>_>
                         *)local_278);
                goto LAB_00323835;
              }
              if (local_278._0_8_ != local_278._8_8_) {
                aVar24 = (anon_struct_8_0_00000001_for___align)local_278._0_8_;
                do {
                  ::std::
                  vector<tinyusdz::value::AssetPath,_std::allocator<tinyusdz::value::AssetPath>_>::
                  push_back(&(this->_stage_metas).subLayers,(value_type *)aVar24);
                  aVar24 = (anon_struct_8_0_00000001_for___align)((long)aVar24 + 0x40);
                } while (aVar24 != (anon_struct_8_0_00000001_for___align)uVar5);
              }
              ::std::vector<tinyusdz::value::AssetPath,_std::allocator<tinyusdz::value::AssetPath>_>
              ::~vector((vector<tinyusdz::value::AssetPath,_std::allocator<tinyusdz::value::AssetPath>_>
                         *)local_278);
            }
            else {
              iVar8 = ::std::__cxx11::string::compare((char *)&local_228);
              if (iVar8 == 0) {
                MetaVariable::get_value<tinyusdz::Token>
                          ((optional<tinyusdz::Token> *)local_1b0,(MetaVariable *)&local_208);
                local_2b8[0] = local_1b0[0];
                if (local_1b0[0] == (ostringstream)0x1) {
                  local_2b0 = (undefined1  [8])&local_2a8._M_parent;
                  if ((undefined1 *)local_1a8._0_8_ == local_198) {
                    local_2a8._M_left =
                         (_Base_ptr)
                         CONCAT44(local_198._12_4_,
                                  CONCAT22(local_198._10_2_,CONCAT11(local_198[9],local_198[8])));
                  }
                  else {
                    local_2b0 = (undefined1  [8])local_1a8._0_8_;
                  }
                  local_2a8._M_parent = (_Base_ptr)local_198._0_8_;
                  local_2a8._0_8_ = local_1a8._8_8_;
                  local_278._0_8_ = (long)local_278 + 0x10;
                  ::std::__cxx11::string::_M_construct<char*>
                            ((string *)local_278,local_2b0,local_1a8._8_8_ + (long)local_2b0);
                  iVar8 = ::std::__cxx11::string::compare((char *)local_278);
                  if (iVar8 == 0) {
                    (this->_stage_metas).upAxis.contained = (storage_t<tinyusdz::Axis>)0x0;
LAB_003246e8:
                    bVar6 = true;
                    if ((this->_stage_metas).upAxis.has_value_ == false) {
                      (this->_stage_metas).upAxis.has_value_ = true;
                    }
                  }
                  else {
                    iVar8 = ::std::__cxx11::string::compare(local_278);
                    if (iVar8 == 0) {
LAB_003246de:
                      (this->_stage_metas).upAxis.contained = (storage_t<tinyusdz::Axis>)0x1;
                      goto LAB_003246e8;
                    }
                    iVar8 = ::std::__cxx11::string::compare(local_278);
                    if (iVar8 == 0) {
                      (this->_stage_metas).upAxis.contained = (storage_t<tinyusdz::Axis>)0x2;
                      goto LAB_003246e8;
                    }
                    if ((this->_option).strict_allowedToken_check != true) {
                      ::std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1b0);
                      ::std::__ostream_insert<char,std::char_traits<char>>
                                ((ostream *)local_1b0,"[warn]",6);
                      ::std::__ostream_insert<char,std::char_traits<char>>
                                ((ostream *)local_1b0,
                                 "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/ascii-parser.cc"
                                 ,0x56);
                      ::std::__ostream_insert<char,std::char_traits<char>>
                                ((ostream *)local_1b0,":",1);
                      ::std::__ostream_insert<char,std::char_traits<char>>
                                ((ostream *)local_1b0,"ParseStageMetaOpt",0x11);
                      ::std::__ostream_insert<char,std::char_traits<char>>
                                ((ostream *)local_1b0,"():",3);
                      poVar10 = (ostream *)
                                ::std::ostream::operator<<((ostringstream *)local_1b0,0x749);
                      ::std::__ostream_insert<char,std::char_traits<char>>(poVar10," ",1);
                      ::std::operator+(&local_1d0,
                                       "Ignore unknown `upAxis` value. Must be \"X\", \"Y\" or \"Z\", but got \""
                                       ,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                         *)local_278);
                      plVar12 = (long *)::std::__cxx11::string::append((char *)&local_1d0);
                      psVar19 = (size_type *)(plVar12 + 2);
                      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                           *)*plVar12 ==
                          (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                           *)psVar19) {
                        local_248.field_2._M_allocated_capacity = *psVar19;
                        local_248.field_2._8_8_ = plVar12[3];
                        local_248._M_dataplus._M_p = (pointer)&local_248.field_2;
                      }
                      else {
                        local_248.field_2._M_allocated_capacity = *psVar19;
                        local_248._M_dataplus._M_p = (pointer)*plVar12;
                      }
                      local_248._M_string_length = plVar12[1];
                      *plVar12 = (long)psVar19;
                      plVar12[1] = 0;
                      *(undefined1 *)(plVar12 + 2) = 0;
                      poVar10 = ::std::__ostream_insert<char,std::char_traits<char>>
                                          ((ostream *)local_1b0,local_248._M_dataplus._M_p,
                                           local_248._M_string_length);
                      ::std::__ostream_insert<char,std::char_traits<char>>(poVar10,"\n",1);
                      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                           *)local_248._M_dataplus._M_p != &local_248.field_2) {
                        operator_delete(local_248._M_dataplus._M_p,
                                        local_248.field_2._M_allocated_capacity + 1);
                      }
                      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                           *)local_1d0._M_dataplus._M_p != &local_1d0.field_2) {
                        operator_delete(local_1d0._M_dataplus._M_p,
                                        local_1d0.field_2._M_allocated_capacity + 1);
                      }
                      ::std::__cxx11::stringbuf::str();
                      PushWarn(this,(string *)&local_248);
                      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                           *)local_248._M_dataplus._M_p != &local_248.field_2) {
                        operator_delete(local_248._M_dataplus._M_p,
                                        local_248.field_2._M_allocated_capacity + 1);
                      }
                      ::std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_1b0);
                      ::std::ios_base::~ios_base(local_140);
                      goto LAB_003246de;
                    }
                    ::std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1b0);
                    ::std::__ostream_insert<char,std::char_traits<char>>
                              ((ostream *)local_1b0,"[error]",7);
                    ::std::__ostream_insert<char,std::char_traits<char>>
                              ((ostream *)local_1b0,
                               "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/ascii-parser.cc"
                               ,0x56);
                    ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1b0,":",1)
                    ;
                    ::std::__ostream_insert<char,std::char_traits<char>>
                              ((ostream *)local_1b0,"ParseStageMetaOpt",0x11);
                    ::std::__ostream_insert<char,std::char_traits<char>>
                              ((ostream *)local_1b0,"():",3);
                    poVar10 = (ostream *)
                              ::std::ostream::operator<<((ostringstream *)local_1b0,0x743);
                    ::std::__ostream_insert<char,std::char_traits<char>>(poVar10," ",1);
                    ::std::operator+(&local_1d0,
                                     "Invalid `upAxis` value. Must be \"X\", \"Y\" or \"Z\", but got \""
                                     ,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                       *)local_278);
                    plVar12 = (long *)::std::__cxx11::string::append((char *)&local_1d0);
                    psVar19 = (size_type *)(plVar12 + 2);
                    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                         *)*plVar12 ==
                        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                         *)psVar19) {
                      local_248.field_2._M_allocated_capacity = *psVar19;
                      local_248.field_2._8_8_ = plVar12[3];
                      local_248._M_dataplus._M_p = (pointer)&local_248.field_2;
                    }
                    else {
                      local_248.field_2._M_allocated_capacity = *psVar19;
                      local_248._M_dataplus._M_p = (pointer)*plVar12;
                    }
                    local_248._M_string_length = plVar12[1];
                    *plVar12 = (long)psVar19;
                    plVar12[1] = 0;
                    *(undefined1 *)(plVar12 + 2) = 0;
                    poVar10 = ::std::__ostream_insert<char,std::char_traits<char>>
                                        ((ostream *)local_1b0,local_248._M_dataplus._M_p,
                                         local_248._M_string_length);
                    ::std::__ostream_insert<char,std::char_traits<char>>(poVar10,"\n",1);
                    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                         *)local_248._M_dataplus._M_p != &local_248.field_2) {
                      operator_delete(local_248._M_dataplus._M_p,
                                      local_248.field_2._M_allocated_capacity + 1);
                    }
                    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                         *)local_1d0._M_dataplus._M_p != &local_1d0.field_2) {
                      operator_delete(local_1d0._M_dataplus._M_p,
                                      local_1d0.field_2._M_allocated_capacity + 1);
                    }
                    ::std::__cxx11::stringbuf::str();
                    PushError(this,(string *)&local_248);
                    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                         *)local_248._M_dataplus._M_p != &local_248.field_2) {
                      operator_delete(local_248._M_dataplus._M_p,
                                      local_248.field_2._M_allocated_capacity + 1);
                    }
                    ::std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_1b0);
                    ::std::ios_base::~ios_base(local_140);
                    bVar6 = false;
                  }
                  if (local_278._0_8_ != (long)local_278 + 0x10) {
                    operator_delete((void *)local_278._0_8_,(ulong)(local_278._16_8_ + 1));
                  }
                }
                else {
                  ::std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1b0);
                  ::std::__ostream_insert<char,std::char_traits<char>>
                            ((ostream *)local_1b0,"[error]",7);
                  ::std::__ostream_insert<char,std::char_traits<char>>
                            ((ostream *)local_1b0,
                             "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/ascii-parser.cc"
                             ,0x56);
                  ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1b0,":",1);
                  ::std::__ostream_insert<char,std::char_traits<char>>
                            ((ostream *)local_1b0,"ParseStageMetaOpt",0x11);
                  ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1b0,"():",3)
                  ;
                  poVar10 = (ostream *)::std::ostream::operator<<((ostringstream *)local_1b0,0x74e);
                  ::std::__ostream_insert<char,std::char_traits<char>>(poVar10," ",1);
                  ::std::__ostream_insert<char,std::char_traits<char>>
                            ((ostream *)local_1b0,"`upAxis` isn\'t a token value.",0x1d);
                  ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1b0,"\n",1);
                  ::std::__cxx11::stringbuf::str();
                  PushError(this,(string *)local_278);
                  if (local_278._0_8_ != (long)local_278 + 0x10) {
                    operator_delete((void *)local_278._0_8_,(ulong)(local_278._16_8_ + 1));
                  }
                  ::std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_1b0);
                  ::std::ios_base::~ios_base(local_140);
                  bVar6 = false;
                }
                if ((local_2b8[0] == (ostringstream)0x1) &&
                   (local_2b0 != (undefined1  [8])&local_2a8._M_parent)) {
                  operator_delete((void *)local_2b0,(ulong)((long)local_2a8._M_parent + 1));
                }
                if (!bVar6) goto LAB_00323835;
              }
              else {
                iVar8 = ::std::__cxx11::string::compare((char *)&local_228);
                if ((iVar8 == 0) ||
                   (iVar8 = ::std::__cxx11::string::compare((char *)&local_228), iVar8 == 0)) {
                  MetaVariable::get_value<tinyusdz::value::StringData>
                            ((optional<tinyusdz::value::StringData> *)local_1b0,
                             (MetaVariable *)&local_208);
                  local_2b8[0] = local_1b0[0];
                  if (local_1b0[0] == (ostringstream)0x1) {
                    local_2b0 = (undefined1  [8])&local_2a8._M_parent;
                    if ((undefined1 *)local_1a8._0_8_ == local_198) {
                      local_2a8._M_left =
                           (_Base_ptr)
                           CONCAT44(local_198._12_4_,
                                    CONCAT22(local_198._10_2_,CONCAT11(local_198[9],local_198[8])));
                    }
                    else {
                      local_2b0 = (undefined1  [8])local_1a8._0_8_;
                    }
                    local_2a8._M_parent = (_Base_ptr)local_198._0_8_;
                    local_2a8._M_right = (_Base_ptr)CONCAT44(local_198._20_4_,local_198._16_4_);
                    local_2a8._0_8_ = local_1a8._8_8_;
                    local_288 = CONCAT44(local_288._4_4_,(undefined4)local_180[0]);
                    ::std::__cxx11::string::_M_assign((string *)&(this->_stage_metas).doc);
                    (this->_stage_metas).doc.line_col = (int)local_288;
                    *(_Base_ptr *)&(this->_stage_metas).doc.is_triple_quoted = local_2a8._M_right;
                    bVar22 = 1;
                  }
                  else {
                    MetaVariable::get_value<std::__cxx11::string>
                              ((optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                *)local_1b0,(MetaVariable *)&local_208);
                    local_278[0] = (string)local_1b0[0];
                    local_280 = (_Base_ptr)CONCAT71(local_280._1_7_,local_1b0[0]);
                    if (local_1b0[0] == (ostringstream)0x1) {
                      local_278._8_8_ = (long)local_278 + 0x18;
                      if ((undefined1 *)local_1a8._0_8_ == local_198) {
                        uStack_258 = CONCAT44(local_198._12_4_,
                                              CONCAT22(local_198._10_2_,
                                                       CONCAT11(local_198[9],local_198[8])));
                      }
                      else {
                        local_278._8_8_ = local_1a8._0_8_;
                      }
                      local_278._24_8_ = local_198._0_8_;
                      local_278._16_8_ = local_1a8._8_8_;
                      local_1a8._0_8_ = (anon_struct_8_0_00000001_for___align)0x0;
                      local_1a8._8_8_ = local_1a8._8_8_ & 0xffffffffffffff00;
                      local_198[8] = false;
                      local_198[9] = false;
                      local_198._12_4_ = 0;
                      local_198._16_4_ = 0;
                      local_1b0 = (undefined1  [8])pcVar1;
                      ::std::__cxx11::string::_M_assign((string *)local_1b0);
                      local_198[8] = false;
                      ::std::__cxx11::string::_M_assign((string *)&(this->_stage_metas).doc);
                      (this->_stage_metas).doc.line_col = local_198._16_4_;
                      (this->_stage_metas).doc.is_triple_quoted = (bool)local_198[8];
                      (this->_stage_metas).doc.single_quote = (bool)local_198[9];
                      *(undefined2 *)&(this->_stage_metas).doc.field_0x22 = local_198._10_2_;
                      (this->_stage_metas).doc.line_row = local_198._12_4_;
                      if (local_1b0 != (undefined1  [8])pcVar1) {
                        operator_delete((void *)local_1b0,(ulong)(local_1a8._8_8_ + 1));
                      }
                    }
                    else {
                      ::std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1b0);
                      ::std::__ostream_insert<char,std::char_traits<char>>
                                ((ostream *)local_1b0,"[error]",7);
                      ::std::__ostream_insert<char,std::char_traits<char>>
                                ((ostream *)local_1b0,
                                 "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/ascii-parser.cc"
                                 ,0x56);
                      ::std::__ostream_insert<char,std::char_traits<char>>
                                ((ostream *)local_1b0,":",1);
                      ::std::__ostream_insert<char,std::char_traits<char>>
                                ((ostream *)local_1b0,"ParseStageMetaOpt",0x11);
                      ::std::__ostream_insert<char,std::char_traits<char>>
                                ((ostream *)local_1b0,"():",3);
                      poVar10 = (ostream *)
                                ::std::ostream::operator<<((ostringstream *)local_1b0,0x75b);
                      ::std::__ostream_insert<char,std::char_traits<char>>(poVar10," ",1);
                      local_1d0._M_dataplus._M_p = (pointer)&local_1d0.field_2;
                      ::std::__cxx11::string::_M_construct<char_const*>
                                ((string *)&local_1d0,"`{}` isn\'t a string value.","");
                      fmt::format<std::__cxx11::string>
                                (&local_248,(fmt *)&local_1d0,(string *)&local_228,pbVar17);
                      poVar10 = ::std::__ostream_insert<char,std::char_traits<char>>
                                          ((ostream *)local_1b0,local_248._M_dataplus._M_p,
                                           local_248._M_string_length);
                      ::std::__ostream_insert<char,std::char_traits<char>>(poVar10,"\n",1);
                      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                           *)local_248._M_dataplus._M_p != &local_248.field_2) {
                        operator_delete(local_248._M_dataplus._M_p,
                                        local_248.field_2._M_allocated_capacity + 1);
                      }
                      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                           *)local_1d0._M_dataplus._M_p != &local_1d0.field_2) {
                        operator_delete(local_1d0._M_dataplus._M_p,
                                        local_1d0.field_2._M_allocated_capacity + 1);
                      }
                      ::std::__cxx11::stringbuf::str();
                      PushError(this,(string *)&local_248);
                      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                           *)local_248._M_dataplus._M_p != &local_248.field_2) {
                        operator_delete(local_248._M_dataplus._M_p,
                                        local_248.field_2._M_allocated_capacity + 1);
                      }
                      ::std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_1b0);
                      ::std::ios_base::~ios_base(local_140);
                    }
                    bVar22 = (byte)local_280;
                    if ((local_278[0] == (string)0x1) && (local_278._8_8_ != (long)local_278 + 0x18)
                       ) {
                      operator_delete((void *)local_278._8_8_,(ulong)(local_278._24_8_ + 1));
                    }
                  }
                  if ((local_2b8[0] == (ostringstream)0x1) &&
                     (local_2b0 != (undefined1  [8])&local_2a8._M_parent)) {
                    operator_delete((void *)local_2b0,(ulong)((long)local_2a8._M_parent + 1));
                  }
                  goto joined_r0x00324f4f;
                }
                iVar8 = ::std::__cxx11::string::compare((char *)&local_228);
                if (iVar8 == 0) {
                  pfVar13 = tinyusdz::value::Value::as<float>((Value *)&local_208,false);
                  if (pfVar13 == (float *)0x0) {
                    psVar15 = (storage_t<double> *)
                              tinyusdz::value::Value::as<double>((Value *)&local_208,false);
                    if (psVar15 == (storage_t<double> *)0x0) {
                      ::std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1b0);
                      ::std::__ostream_insert<char,std::char_traits<char>>
                                ((ostream *)local_1b0,"[error]",7);
                      ::std::__ostream_insert<char,std::char_traits<char>>
                                ((ostream *)local_1b0,
                                 "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/ascii-parser.cc"
                                 ,0x56);
                      ::std::__ostream_insert<char,std::char_traits<char>>
                                ((ostream *)local_1b0,":",1);
                      ::std::__ostream_insert<char,std::char_traits<char>>
                                ((ostream *)local_1b0,"ParseStageMetaOpt",0x11);
                      ::std::__ostream_insert<char,std::char_traits<char>>
                                ((ostream *)local_1b0,"():",3);
                      poVar10 = (ostream *)
                                ::std::ostream::operator<<((ostringstream *)local_1b0,0x766);
                      ::std::__ostream_insert<char,std::char_traits<char>>(poVar10," ",1);
                      pcVar26 = "`metersPerUnit` isn\'t a floating-point value.";
                      lVar21 = 0x2d;
LAB_003237be:
                      ::std::__ostream_insert<char,std::char_traits<char>>
                                ((ostream *)local_1b0,pcVar26,lVar21);
                      ::std::__ostream_insert<char,std::char_traits<char>>
                                ((ostream *)local_1b0,"\n",1);
                      ::std::__cxx11::stringbuf::str();
                      PushError(this,(string *)local_2b8);
                      pvVar25 = (value_type *)local_2a8._0_8_;
                      aVar24 = (anon_struct_8_0_00000001_for___align)local_2b8;
                      if (local_2b8 != (undefined1  [8])&local_2a8) {
LAB_0032380c:
                        operator_delete((void *)aVar24,
                                        (ulong)((long)&(pvVar25->asset_path_)._M_dataplus._M_p + 1))
                        ;
                      }
LAB_00323814:
                      ::std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_1b0);
                      ::std::ios_base::~ios_base(local_140);
                      goto LAB_00323835;
                    }
                    sVar2 = *psVar15;
                  }
                  else {
                    sVar2 = (storage_t<double>)(double)*pfVar13;
                  }
                  (this->_stage_metas).metersPerUnit.contained = sVar2;
                  if ((this->_stage_metas).metersPerUnit.has_value_ == false) {
                    (this->_stage_metas).metersPerUnit.has_value_ = true;
                  }
                }
                else {
                  iVar8 = ::std::__cxx11::string::compare((char *)&local_228);
                  if (iVar8 == 0) {
                    pfVar13 = tinyusdz::value::Value::as<float>((Value *)&local_208,false);
                    if (pfVar13 == (float *)0x0) {
                      psVar15 = (storage_t<double> *)
                                tinyusdz::value::Value::as<double>((Value *)&local_208,false);
                      if (psVar15 == (storage_t<double> *)0x0) {
                        ::std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1b0);
                        ::std::__ostream_insert<char,std::char_traits<char>>
                                  ((ostream *)local_1b0,"[error]",7);
                        ::std::__ostream_insert<char,std::char_traits<char>>
                                  ((ostream *)local_1b0,
                                   "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/ascii-parser.cc"
                                   ,0x56);
                        ::std::__ostream_insert<char,std::char_traits<char>>
                                  ((ostream *)local_1b0,":",1);
                        ::std::__ostream_insert<char,std::char_traits<char>>
                                  ((ostream *)local_1b0,"ParseStageMetaOpt",0x11);
                        ::std::__ostream_insert<char,std::char_traits<char>>
                                  ((ostream *)local_1b0,"():",3);
                        poVar10 = (ostream *)
                                  ::std::ostream::operator<<((ostringstream *)local_1b0,0x771);
                        ::std::__ostream_insert<char,std::char_traits<char>>(poVar10," ",1);
                        pcVar26 = "`kilogramsPerUnit` isn\'t a floating-point value.";
                        lVar21 = 0x30;
                        goto LAB_003237be;
                      }
                      sVar2 = *psVar15;
                    }
                    else {
                      sVar2 = (storage_t<double>)(double)*pfVar13;
                    }
                    (this->_stage_metas).kilogramsPerUnit.contained = sVar2;
                    if ((this->_stage_metas).kilogramsPerUnit.has_value_ == false) {
                      (this->_stage_metas).kilogramsPerUnit.has_value_ = true;
                    }
                  }
                  else {
                    iVar8 = ::std::__cxx11::string::compare((char *)&local_228);
                    if (iVar8 == 0) {
                      pfVar13 = tinyusdz::value::Value::as<float>((Value *)&local_208,false);
                      if (pfVar13 == (float *)0x0) {
                        psVar15 = (storage_t<double> *)
                                  tinyusdz::value::Value::as<double>((Value *)&local_208,false);
                        if (psVar15 == (storage_t<double> *)0x0) {
                          ::std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1b0);
                          ::std::__ostream_insert<char,std::char_traits<char>>
                                    ((ostream *)local_1b0,"[error]",7);
                          ::std::__ostream_insert<char,std::char_traits<char>>
                                    ((ostream *)local_1b0,
                                     "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/ascii-parser.cc"
                                     ,0x56);
                          ::std::__ostream_insert<char,std::char_traits<char>>
                                    ((ostream *)local_1b0,":",1);
                          ::std::__ostream_insert<char,std::char_traits<char>>
                                    ((ostream *)local_1b0,"ParseStageMetaOpt",0x11);
                          ::std::__ostream_insert<char,std::char_traits<char>>
                                    ((ostream *)local_1b0,"():",3);
                          poVar10 = (ostream *)
                                    ::std::ostream::operator<<((ostringstream *)local_1b0,0x77d);
                          ::std::__ostream_insert<char,std::char_traits<char>>(poVar10," ",1);
                          pcVar26 = "`timeCodesPerSecond` isn\'t a floating-point value.";
                          lVar21 = 0x32;
                          goto LAB_003237be;
                        }
                        sVar2 = *psVar15;
                      }
                      else {
                        sVar2 = (storage_t<double>)(double)*pfVar13;
                      }
                      (this->_stage_metas).timeCodesPerSecond.contained = sVar2;
                      if ((this->_stage_metas).timeCodesPerSecond.has_value_ == false) {
                        (this->_stage_metas).timeCodesPerSecond.has_value_ = true;
                      }
                    }
                    else {
                      iVar8 = ::std::__cxx11::string::compare((char *)&local_228);
                      if (iVar8 == 0) {
                        pfVar13 = tinyusdz::value::Value::as<float>((Value *)&local_208,false);
                        if (pfVar13 == (float *)0x0) {
                          psVar15 = (storage_t<double> *)
                                    tinyusdz::value::Value::as<double>((Value *)&local_208,false);
                          if (psVar15 == (storage_t<double> *)0x0) goto LAB_0032473d;
                          sVar2 = *psVar15;
                        }
                        else {
                          sVar2 = (storage_t<double>)(double)*pfVar13;
                        }
                        (this->_stage_metas).startTimeCode.contained = sVar2;
                        if ((this->_stage_metas).startTimeCode.has_value_ == false) {
                          (this->_stage_metas).startTimeCode.has_value_ = true;
                        }
                      }
                      else {
                        iVar8 = ::std::__cxx11::string::compare((char *)&local_228);
                        if (iVar8 == 0) {
                          pfVar13 = tinyusdz::value::Value::as<float>((Value *)&local_208,false);
                          if (pfVar13 == (float *)0x0) {
                            psVar15 = (storage_t<double> *)
                                      tinyusdz::value::Value::as<double>((Value *)&local_208,false);
                            if (psVar15 == (storage_t<double> *)0x0) goto LAB_0032473d;
                            sVar2 = *psVar15;
                          }
                          else {
                            sVar2 = (storage_t<double>)(double)*pfVar13;
                          }
                          (this->_stage_metas).endTimeCode.contained = sVar2;
                          if ((this->_stage_metas).endTimeCode.has_value_ == false) {
                            (this->_stage_metas).endTimeCode.has_value_ = true;
                          }
                        }
                        else {
                          iVar8 = ::std::__cxx11::string::compare((char *)&local_228);
                          if (iVar8 == 0) {
                            pfVar13 = tinyusdz::value::Value::as<float>((Value *)&local_208,false);
                            if (pfVar13 == (float *)0x0) {
                              psVar15 = (storage_t<double> *)
                                        tinyusdz::value::Value::as<double>
                                                  ((Value *)&local_208,false);
                              if (psVar15 == (storage_t<double> *)0x0) goto LAB_0032473d;
                              sVar2 = *psVar15;
                            }
                            else {
                              sVar2 = (storage_t<double>)(double)*pfVar13;
                            }
                            (this->_stage_metas).framesPerSecond.contained = sVar2;
                            if ((this->_stage_metas).framesPerSecond.has_value_ == false) {
                              (this->_stage_metas).framesPerSecond.has_value_ = true;
                            }
                          }
                          else {
                            iVar8 = ::std::__cxx11::string::compare((char *)&local_228);
                            if (iVar8 == 0) {
                              MetaVariable::
                              get_value<std::vector<tinyusdz::Token,std::allocator<tinyusdz::Token>>>
                                        ((optional<std::vector<tinyusdz::Token,_std::allocator<tinyusdz::Token>_>_>
                                          *)local_1b0,(MetaVariable *)&local_208);
                              uVar5 = local_1a8._8_8_;
                              aVar24 = (anon_struct_8_0_00000001_for___align)local_1a8._0_8_;
                              local_2b8[0] = local_1b0[0];
                              if (local_1b0[0] != (ostringstream)0x1) {
                                ::std::__cxx11::ostringstream::ostringstream
                                          ((ostringstream *)local_1b0);
                                ::std::__ostream_insert<char,std::char_traits<char>>
                                          ((ostream *)local_1b0,"[error]",7);
                                ::std::__ostream_insert<char,std::char_traits<char>>
                                          ((ostream *)local_1b0,
                                           "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/ascii-parser.cc"
                                           ,0x56);
                                ::std::__ostream_insert<char,std::char_traits<char>>
                                          ((ostream *)local_1b0,":",1);
                                ::std::__ostream_insert<char,std::char_traits<char>>
                                          ((ostream *)local_1b0,"ParseStageMetaOpt",0x11);
                                ::std::__ostream_insert<char,std::char_traits<char>>
                                          ((ostream *)local_1b0,"():",3);
                                poVar10 = (ostream *)
                                          ::std::ostream::operator<<
                                                    ((ostringstream *)local_1b0,0x7a4);
                                ::std::__ostream_insert<char,std::char_traits<char>>(poVar10," ",1);
                                ::std::__ostream_insert<char,std::char_traits<char>>
                                          ((ostream *)local_1b0,
                                           "`apiSchemas` isn\'t an `token[]` type.",0x25);
                                ::std::__ostream_insert<char,std::char_traits<char>>
                                          ((ostream *)local_1b0,"\n",1);
                                ::std::__cxx11::stringbuf::str();
                                PushError(this,(string *)local_278);
                                pvVar25 = (value_type *)local_278._16_8_;
                                aVar24 = (anon_struct_8_0_00000001_for___align)local_278._0_8_;
                                if (local_278._0_8_ != (long)local_278 + 0x10) goto LAB_0032380c;
                                goto LAB_00323814;
                              }
                              local_2b0 = (undefined1  [8])local_1a8._0_8_;
                              local_2a8._0_8_ = local_1a8._8_8_;
                              local_2a8._M_parent = (_Base_ptr)local_198._0_8_;
                              local_1a8._0_8_ = (anon_struct_8_0_00000001_for___align)0x0;
                              local_1a8._8_8_ = (value_type *)0x0;
                              local_198._0_8_ = (_Link_type)0x0;
                              ::std::vector<tinyusdz::Token,_std::allocator<tinyusdz::Token>_>::
                              ~vector((vector<tinyusdz::Token,_std::allocator<tinyusdz::Token>_> *)
                                      local_1a8);
                              local_38 = (anon_struct_8_0_00000001_for___align)uVar5;
                              if (aVar24 == (anon_struct_8_0_00000001_for___align)uVar5) {
                                ::std::vector<tinyusdz::Token,_std::allocator<tinyusdz::Token>_>::
                                ~vector((vector<tinyusdz::Token,_std::allocator<tinyusdz::Token>_> *
                                        )local_2b0);
                              }
                              else {
                                local_280 = (_Base_ptr)
                                            &(this->_supported_api_schemas)._M_t._M_impl.
                                             super__Rb_tree_header;
                                do {
                                  cVar14 = ::std::
                                           _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                           ::find((
                                                  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  *)&this->_supported_api_schemas,(key_type *)aVar24
                                                 );
                                  if (cVar14._M_node == local_280) {
                                    ::std::__cxx11::ostringstream::ostringstream
                                              ((ostringstream *)local_1b0);
                                    ::std::__ostream_insert<char,std::char_traits<char>>
                                              ((ostream *)local_1b0,"[error]",7);
                                    ::std::__ostream_insert<char,std::char_traits<char>>
                                              ((ostream *)local_1b0,
                                               "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/ascii-parser.cc"
                                               ,0x56);
                                    ::std::__ostream_insert<char,std::char_traits<char>>
                                              ((ostream *)local_1b0,":",1);
                                    ::std::__ostream_insert<char,std::char_traits<char>>
                                              ((ostream *)local_1b0,"ParseStageMetaOpt",0x11);
                                    ::std::__ostream_insert<char,std::char_traits<char>>
                                              ((ostream *)local_1b0,"():",3);
                                    poVar10 = (ostream *)
                                              ::std::ostream::operator<<
                                                        ((ostringstream *)local_1b0,0x7a0);
                                    ::std::__ostream_insert<char,std::char_traits<char>>
                                              (poVar10," ",1);
                                    ::std::__ostream_insert<char,std::char_traits<char>>
                                              ((ostream *)local_1b0,"\"",1);
                                    poVar10 = ::std::__ostream_insert<char,std::char_traits<char>>
                                                        ((ostream *)local_1b0,*(char **)aVar24,
                                                         (long)*(_Base_ptr *)((long)aVar24 + 8));
                                    ::std::__ostream_insert<char,std::char_traits<char>>
                                              (poVar10,
                                               "\" is not supported(at the moment) for `apiSchemas` in TinyUSDZ."
                                               ,0x3f);
                                    ::std::__ostream_insert<char,std::char_traits<char>>
                                              (poVar10,"\n",1);
                                    ::std::__cxx11::stringbuf::str();
                                    PushError(this,(string *)local_278);
                                    if (local_278._0_8_ != (long)local_278 + 0x10) {
                                      operator_delete((void *)local_278._0_8_,
                                                      (ulong)(local_278._16_8_ + 1));
                                    }
                                    ::std::__cxx11::ostringstream::~ostringstream
                                              ((ostringstream *)local_1b0);
                                    ::std::ios_base::~ios_base(local_140);
                                    break;
                                  }
                                  aVar24 = (anon_struct_8_0_00000001_for___align)
                                           ((long)aVar24 + 0x20);
                                } while (aVar24 != local_38);
                                ::std::vector<tinyusdz::Token,_std::allocator<tinyusdz::Token>_>::
                                ~vector((vector<tinyusdz::Token,_std::allocator<tinyusdz::Token>_> *
                                        )local_2b0);
                                if (cVar14._M_node == local_280) goto LAB_00323835;
                              }
                            }
                            else {
                              iVar8 = ::std::__cxx11::string::compare((char *)&local_228);
                              if (iVar8 == 0) {
                                MetaVariable::
                                get_value<std::map<std::__cxx11::string,tinyusdz::MetaVariable,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,tinyusdz::MetaVariable>>>>
                                          ((optional<std::map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::MetaVariable,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::MetaVariable>_>_>_>
                                            *)local_1b0,(MetaVariable *)&local_208);
                                pcVar4 = (pointer)CONCAT44(local_198._12_4_,local_198._16_4_);
                                local_2b8[0] = local_1b0[0];
                                oVar23 = local_1b0[0];
                                if (local_1b0[0] == (ostringstream)0x1) {
                                  local_2a8._M_left = &local_2a8;
                                  if ((_Link_type)local_198._0_8_ == (_Link_type)0x0) {
                                    psVar16 = &local_288;
                                    local_2a8._M_parent = (_Base_ptr)0x0;
                                    uVar20 = 0;
                                    local_2a8._M_right = local_2a8._M_left;
                                  }
                                  else {
                                    psVar16 = local_180;
                                    local_2a8._M_parent = (_Base_ptr)local_198._0_8_;
                                    p_Var3 = (_Rb_tree_node_base *)
                                             CONCAT44(local_198._12_4_,
                                                      CONCAT22(local_198._10_2_,
                                                               CONCAT11(local_198[9],local_198[8])))
                                    ;
                                    *(_Base_ptr *)(local_198._0_8_ + 8) = local_2a8._M_left;
                                    local_288 = CONCAT44(local_180[0]._4_4_,(undefined4)local_180[0]
                                                        );
                                    local_198._0_8_ = (_Link_type)0x0;
                                    local_198[8] = SUB81(pcVar1,0);
                                    local_198[9] = (undefined1)((ulong)pcVar1 >> 8);
                                    local_198._10_2_ = (undefined2)((ulong)pcVar1 >> 0x10);
                                    local_198._12_4_ = (undefined4)((ulong)pcVar1 >> 0x20);
                                    local_2a8._M_left = p_Var3;
                                    local_2a8._M_right =
                                         (_Rb_tree_node_base *)
                                         CONCAT44(local_198._20_4_,local_198._16_4_);
                                    uVar20 = local_1a8._8_4_;
                                    local_198._20_4_ = local_198._12_4_;
                                    pcVar4 = pcVar1;
                                  }
                                  local_198._12_4_ = (undefined4)((ulong)pcVar4 >> 0x20);
                                  local_198._16_4_ = SUB84(pcVar4,0);
                                  *psVar16 = 0;
                                  local_2a8._M_color = uVar20;
                                  ::std::
                                  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::MetaVariable>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::MetaVariable>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::MetaVariable>_>_>
                                  ::_M_erase((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::MetaVariable>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::MetaVariable>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::MetaVariable>_>_>
                                              *)local_1a8,(_Link_type)0x0);
                                  oVar23 = local_2b8[0];
                                }
                                if (((byte)oVar23 & 1) == 0) {
                                  ::std::__cxx11::ostringstream::ostringstream
                                            ((ostringstream *)local_1b0);
                                  ::std::__ostream_insert<char,std::char_traits<char>>
                                            ((ostream *)local_1b0,"[error]",7);
                                  ::std::__ostream_insert<char,std::char_traits<char>>
                                            ((ostream *)local_1b0,
                                             "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/ascii-parser.cc"
                                             ,0x56);
                                  ::std::__ostream_insert<char,std::char_traits<char>>
                                            ((ostream *)local_1b0,":",1);
                                  ::std::__ostream_insert<char,std::char_traits<char>>
                                            ((ostream *)local_1b0,"ParseStageMetaOpt",0x11);
                                  ::std::__ostream_insert<char,std::char_traits<char>>
                                            ((ostream *)local_1b0,"():",3);
                                  poVar10 = (ostream *)
                                            ::std::ostream::operator<<
                                                      ((ostringstream *)local_1b0,0x7aa);
                                  ::std::__ostream_insert<char,std::char_traits<char>>
                                            (poVar10," ",1);
                                  ::std::__ostream_insert<char,std::char_traits<char>>
                                            ((ostream *)local_1b0,
                                             "`customLayerData` isn\'t a dictionary value.",0x2b);
                                  ::std::__ostream_insert<char,std::char_traits<char>>
                                            ((ostream *)local_1b0,"\n",1);
                                  ::std::__cxx11::stringbuf::str();
                                  PushError(this,(string *)local_278);
                                  if (local_278._0_8_ != (long)local_278 + 0x10) {
                                    operator_delete((void *)local_278._0_8_,
                                                    (ulong)(local_278._16_8_ + 1));
                                  }
                                  ::std::__cxx11::ostringstream::~ostringstream
                                            ((ostringstream *)local_1b0);
                                  ::std::ios_base::~ios_base(local_140);
                                }
                                else {
                                  std::
                                  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::MetaVariable>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::MetaVariable>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::MetaVariable>_>_>
                                  ::operator=((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::MetaVariable>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::MetaVariable>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::MetaVariable>_>_>
                                               *)&(this->_stage_metas).customLayerData,
                                              (_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::MetaVariable>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::MetaVariable>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::MetaVariable>_>_>
                                               *)local_2b0);
                                }
                                if (local_2b8[0] == (ostringstream)0x1) {
                                  ::std::
                                  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::MetaVariable>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::MetaVariable>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::MetaVariable>_>_>
                                  ::_M_erase((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::MetaVariable>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::MetaVariable>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::MetaVariable>_>_>
                                              *)local_2b0,(_Link_type)local_2a8._M_parent);
                                }
                                bVar22 = (byte)oVar23 & 1;
                              }
                              else {
                                iVar8 = ::std::__cxx11::string::compare((char *)&local_228);
                                if (iVar8 != 0) {
                                  ::std::__cxx11::ostringstream::ostringstream
                                            ((ostringstream *)local_1b0);
                                  ::std::__ostream_insert<char,std::char_traits<char>>
                                            ((ostream *)local_1b0,"[warn]",6);
                                  ::std::__ostream_insert<char,std::char_traits<char>>
                                            ((ostream *)local_1b0,
                                             "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/ascii-parser.cc"
                                             ,0x56);
                                  ::std::__ostream_insert<char,std::char_traits<char>>
                                            ((ostream *)local_1b0,":",1);
                                  ::std::__ostream_insert<char,std::char_traits<char>>
                                            ((ostream *)local_1b0,"ParseStageMetaOpt",0x11);
                                  ::std::__ostream_insert<char,std::char_traits<char>>
                                            ((ostream *)local_1b0,"():",3);
                                  poVar10 = (ostream *)
                                            ::std::ostream::operator<<
                                                      ((optional<tinyusdz::value::StringData> *)
                                                       local_1b0,0x7ba);
                                  ::std::__ostream_insert<char,std::char_traits<char>>
                                            (poVar10," ",1);
                                  ::std::__ostream_insert<char,std::char_traits<char>>
                                            ((ostream *)local_1b0,"TODO: Stage meta: ",0x12);
                                  poVar10 = ::std::__ostream_insert<char,std::char_traits<char>>
                                                      ((ostream *)local_1b0,
                                                       local_228._M_dataplus._M_p,
                                                       local_228._M_string_length);
                                  ::std::__ostream_insert<char,std::char_traits<char>>
                                            (poVar10,"\n",1);
                                  ::std::__cxx11::stringbuf::str();
                                  PushWarn(this,(string *)local_2b8);
                                  if (local_2b8 != (undefined1  [8])&local_2a8) {
                                    operator_delete((void *)local_2b8,(ulong)(local_2a8._0_8_ + 1));
                                  }
                                  ::std::__cxx11::ostringstream::~ostringstream
                                            ((ostringstream *)local_1b0);
                                  ::std::ios_base::~ios_base(local_140);
                                  goto LAB_0032473d;
                                }
                                MetaVariable::get_value<tinyusdz::value::StringData>
                                          ((optional<tinyusdz::value::StringData> *)local_1b0,
                                           (MetaVariable *)&local_208);
                                local_2b8[0] = local_1b0[0];
                                if (local_1b0[0] == (ostringstream)0x1) {
                                  local_2b0 = (undefined1  [8])&local_2a8._M_parent;
                                  if ((undefined1 *)local_1a8._0_8_ == local_198) {
                                    local_2a8._M_left =
                                         (_Base_ptr)
                                         CONCAT44(local_198._12_4_,
                                                  CONCAT22(local_198._10_2_,
                                                           CONCAT11(local_198[9],local_198[8])));
                                  }
                                  else {
                                    local_2b0 = (undefined1  [8])local_1a8._0_8_;
                                  }
                                  local_2a8._M_parent = (_Base_ptr)local_198._0_8_;
                                  local_2a8._M_right =
                                       (_Base_ptr)CONCAT44(local_198._20_4_,local_198._16_4_);
                                  local_2a8._0_8_ = local_1a8._8_8_;
                                  local_288 = CONCAT44(local_288._4_4_,(undefined4)local_180[0]);
                                  ::std::__cxx11::string::_M_assign
                                            ((string *)&(this->_stage_metas).comment);
                                  (this->_stage_metas).comment.line_col = (int)local_288;
                                  *(_Base_ptr *)&(this->_stage_metas).comment.is_triple_quoted =
                                       local_2a8._M_right;
                                  local_280 = (_Base_ptr)CONCAT71(local_280._1_7_,1);
                                }
                                else {
                                  MetaVariable::get_value<std::__cxx11::string>
                                            ((optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                              *)local_1b0,(MetaVariable *)&local_208);
                                  pbVar17 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                             *)(local_278 + 0x18);
                                  local_278[0] = (string)local_1b0[0];
                                  local_280 = (_Base_ptr)CONCAT71(local_280._1_7_,local_1b0[0]);
                                  if (local_1b0[0] == (ostringstream)0x1) {
                                    local_278._8_8_ = (long)local_278 + 0x18;
                                    if ((undefined1 *)local_1a8._0_8_ == local_198) {
                                      uStack_258 = CONCAT44(local_198._12_4_,
                                                            CONCAT22(local_198._10_2_,
                                                                     CONCAT11(local_198[9],
                                                                              local_198[8])));
                                    }
                                    else {
                                      local_278._8_8_ = local_1a8._0_8_;
                                    }
                                    local_278._24_8_ = local_198._0_8_;
                                    local_278._16_8_ = local_1a8._8_8_;
                                    local_1a8._0_8_ = (anon_struct_8_0_00000001_for___align)0x0;
                                    local_1a8._8_8_ = local_1a8._8_8_ & 0xffffffffffffff00;
                                    local_198[8] = false;
                                    local_198[9] = false;
                                    local_198._12_4_ = 0;
                                    local_198._16_4_ = 0;
                                    local_1b0 = (undefined1  [8])pcVar1;
                                    ::std::__cxx11::string::_M_assign((string *)local_1b0);
                                    local_198[8] = false;
                                    ::std::__cxx11::string::_M_assign
                                              ((string *)&(this->_stage_metas).comment);
                                    (this->_stage_metas).comment.line_col = local_198._16_4_;
                                    (this->_stage_metas).comment.is_triple_quoted =
                                         (bool)local_198[8];
                                    (this->_stage_metas).comment.single_quote = (bool)local_198[9];
                                    *(undefined2 *)&(this->_stage_metas).comment.field_0x22 =
                                         local_198._10_2_;
                                    (this->_stage_metas).comment.line_row = local_198._12_4_;
                                    if (local_1b0 != (undefined1  [8])pcVar1) {
                                      operator_delete((void *)local_1b0,(ulong)(local_1a8._8_8_ + 1)
                                                     );
                                    }
                                  }
                                  else {
                                    ::std::__cxx11::ostringstream::ostringstream
                                              ((ostringstream *)local_1b0);
                                    ::std::__ostream_insert<char,std::char_traits<char>>
                                              ((ostream *)local_1b0,"[error]",7);
                                    ::std::__ostream_insert<char,std::char_traits<char>>
                                              ((ostream *)local_1b0,
                                               "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/ascii-parser.cc"
                                               ,0x56);
                                    ::std::__ostream_insert<char,std::char_traits<char>>
                                              ((ostream *)local_1b0,":",1);
                                    ::std::__ostream_insert<char,std::char_traits<char>>
                                              ((ostream *)local_1b0,"ParseStageMetaOpt",0x11);
                                    ::std::__ostream_insert<char,std::char_traits<char>>
                                              ((ostream *)local_1b0,"():",3);
                                    poVar10 = (ostream *)
                                              ::std::ostream::operator<<
                                                        ((ostringstream *)local_1b0,0x7b6);
                                    ::std::__ostream_insert<char,std::char_traits<char>>
                                              (poVar10," ",1);
                                    local_1d0._M_dataplus._M_p = (pointer)&local_1d0.field_2;
                                    ::std::__cxx11::string::_M_construct<char_const*>
                                              ((string *)&local_1d0,"`{}` isn\'t a string value.",""
                                              );
                                    fmt::format<std::__cxx11::string>
                                              (&local_248,(fmt *)&local_1d0,(string *)&local_228,
                                               pbVar17);
                                    poVar10 = ::std::__ostream_insert<char,std::char_traits<char>>
                                                        ((ostream *)local_1b0,
                                                         local_248._M_dataplus._M_p,
                                                         local_248._M_string_length);
                                    ::std::__ostream_insert<char,std::char_traits<char>>
                                              (poVar10,"\n",1);
                                    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                                         *)local_248._M_dataplus._M_p != &local_248.field_2) {
                                      operator_delete(local_248._M_dataplus._M_p,
                                                      local_248.field_2._M_allocated_capacity + 1);
                                    }
                                    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                                         *)local_1d0._M_dataplus._M_p != &local_1d0.field_2) {
                                      operator_delete(local_1d0._M_dataplus._M_p,
                                                      local_1d0.field_2._M_allocated_capacity + 1);
                                    }
                                    ::std::__cxx11::stringbuf::str();
                                    PushError(this,(string *)&local_248);
                                    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                                         *)local_248._M_dataplus._M_p != &local_248.field_2) {
                                      operator_delete(local_248._M_dataplus._M_p,
                                                      local_248.field_2._M_allocated_capacity + 1);
                                    }
                                    ::std::__cxx11::ostringstream::~ostringstream
                                              ((ostringstream *)local_1b0);
                                    ::std::ios_base::~ios_base(local_140);
                                  }
                                  if ((local_278[0] == (string)0x1) &&
                                     (local_278._8_8_ != (long)local_278 + 0x18)) {
                                    operator_delete((void *)local_278._8_8_,
                                                    (ulong)(local_278._24_8_ + 1));
                                  }
                                }
                                if ((local_2b8[0] == (ostringstream)0x1) &&
                                   (local_2b0 != (undefined1  [8])&local_2a8._M_parent)) {
                                  operator_delete((void *)local_2b0,
                                                  (ulong)((long)local_2a8._M_parent + 1));
                                }
                                bVar22 = (byte)local_280;
                              }
joined_r0x00324f4f:
                              if (bVar22 == 0) goto LAB_00323835;
                            }
                          }
                        }
                      }
                    }
                  }
                }
              }
            }
LAB_0032473d:
            bVar6 = true;
          }
          if (paStack_1f0 != &local_1e0) {
            operator_delete(paStack_1f0,
                            CONCAT71(local_1e0._M_allocated_capacity._1_7_,local_1e0._M_local_buf[0]
                                    ) + 1);
          }
          if (local_1f8 != (undefined8 *)0x0) {
            (*(code *)local_1f8[4])(&local_208);
          }
          goto LAB_003236ec;
        }
      }
      else {
        ::std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1b0);
        ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1b0,"[error]",7);
        ::std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)local_1b0,
                   "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/ascii-parser.cc"
                   ,0x56);
        ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1b0,":",1);
        ::std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)local_1b0,"ParseStageMetaOpt",0x11);
        ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1b0,"():",3);
        poVar10 = (ostream *)::std::ostream::operator<<((ostringstream *)local_1b0,0x712);
        ::std::__ostream_insert<char,std::char_traits<char>>(poVar10," ",1);
        ::std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)local_1b0,"\'=\' expected in Stage Metadata opt.",0x23);
        ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1b0,"\n",1);
        ::std::__cxx11::stringbuf::str();
        PushError(this,(string *)&local_208);
        if ((undefined8 **)local_208.dynamic != &local_1f8) {
          operator_delete(local_208.dynamic,(long)local_1f8 + 1);
        }
        ::std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_1b0);
        ::std::ios_base::~ios_base(local_140);
      }
    }
  }
  bVar6 = false;
LAB_003236ec:
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_228._M_dataplus._M_p != &local_228.field_2) {
    operator_delete(local_228._M_dataplus._M_p,
                    CONCAT71(local_228.field_2._M_allocated_capacity._1_7_,
                             local_228.field_2._M_local_buf[0]) + 1);
  }
  return bVar6;
}

Assistant:

bool AsciiParser::ParseStageMetaOpt() {
  // Maybe string-only comment.
  // Comment cannot have multiple lines. The last one wins
  {
    value::StringData str;
    if (MaybeTripleQuotedString(&str)) {
      _stage_metas.comment = str;
      return true;
    } else if (MaybeString(&str)) {
      _stage_metas.comment = str;
      return true;
    }
  }

  std::string varname;
  if (!ReadIdentifier(&varname)) {
    return false;
  }

  DCOUT("varname = " << varname);

  if (!IsStageMeta(varname)) {
    std::string msg = "'" + varname + "' is not a Stage Metadata variable.\n";
    PUSH_ERROR_AND_RETURN(msg);
    return false;
  }

  if (!Expect('=')) {
    PUSH_ERROR_AND_RETURN("'=' expected in Stage Metadata opt.");
    return false;
  }

  if (!SkipWhitespace()) {
    return false;
  }

  const VariableDef &vardef = _supported_stage_metas.at(varname);
  MetaVariable var;
  if (!ParseMetaValue(vardef, &var)) {
    PUSH_ERROR_AND_RETURN("Failed to parse meta value.\n");
    return false;
  }
  var.set_name(varname);

  if (varname == "defaultPrim") {
    value::token tok;
    if (var.get_value(&tok)) {
      DCOUT("defaultPrim = " << tok);
      _stage_metas.defaultPrim = tok;
    } else {
      PUSH_ERROR_AND_RETURN("`defaultPrim` isn't a token value.");
    }
  } else if (varname == "subLayers") {
    std::vector<value::AssetPath> paths;
    if (var.get_value(&paths)) {
      DCOUT("subLayers = " << paths);
      for (const auto &item : paths) {
        _stage_metas.subLayers.push_back(item);
      }
    } else {
      PUSH_ERROR_AND_RETURN("`subLayers` isn't an array of asset path");
    }
  } else if (varname == "upAxis") {
    if (auto pv = var.get_value<value::token>()) {
      DCOUT("upAxis = " << pv.value());
      const std::string s = pv.value().str();
      if (s == "X") {
        _stage_metas.upAxis = Axis::X;
      } else if (s == "Y") {
        _stage_metas.upAxis = Axis::Y;
      } else if (s == "Z") {
        _stage_metas.upAxis = Axis::Z;
      } else {
        if (_option.strict_allowedToken_check) {
          PUSH_ERROR_AND_RETURN(
              "Invalid `upAxis` value. Must be \"X\", \"Y\" or \"Z\", but got "
              "\"" +
              s + "\"(Note: Case sensitive)");
        } else {
          PUSH_WARN(
              "Ignore unknown `upAxis` value. Must be \"X\", \"Y\" or \"Z\", "
              "but got "
              "\"" +
              s + "\"(Note: Case sensitive). Use default upAxis `Y`.");
          _stage_metas.upAxis = Axis::Y;
        }
      }
    } else {
      PUSH_ERROR_AND_RETURN("`upAxis` isn't a token value.");
    }
  } else if ((varname == "doc") || (varname == "documentation")) {
    // `documentation` will be shorten to `doc`
    if (auto pv = var.get_value<value::StringData>()) {
      DCOUT("doc = " << to_string(pv.value()));
      _stage_metas.doc = pv.value();
    } else if (auto pvs = var.get_value<std::string>()) {
      value::StringData sdata;
      sdata.value = pvs.value();
      sdata.is_triple_quoted = false;
      _stage_metas.doc = sdata;
    } else {
      PUSH_ERROR_AND_RETURN(fmt::format("`{}` isn't a string value.", varname));
    }
  } else if (varname == "metersPerUnit") {
    DCOUT("ty = " << var.type_name());
    if (auto pv = var.get_value<float>()) {
      DCOUT("metersPerUnit = " << pv.value());
      _stage_metas.metersPerUnit = double(pv.value());
    } else if (auto pvd = var.get_value<double>()) {
      DCOUT("metersPerUnit = " << pvd.value());
      _stage_metas.metersPerUnit = pvd.value();
    } else {
      PUSH_ERROR_AND_RETURN("`metersPerUnit` isn't a floating-point value.");
    }
  } else if (varname == "kilogramsPerUnit") {
    DCOUT("ty = " << var.type_name());
    if (auto pv = var.get_value<float>()) {
      DCOUT("kilogramsPerUnit = " << pv.value());
      _stage_metas.kilogramsPerUnit = double(pv.value());
    } else if (auto pvd = var.get_value<double>()) {
      DCOUT("kilogramsPerUnit = " << pvd.value());
      _stage_metas.kilogramsPerUnit = pvd.value();
    } else {
      PUSH_ERROR_AND_RETURN("`kilogramsPerUnit` isn't a floating-point value.");
    }
  } else if (varname == "timeCodesPerSecond") {
    DCOUT("ty = " << var.type_name());
    if (auto pv = var.get_value<float>()) {
      DCOUT("metersPerUnit = " << pv.value());
      _stage_metas.timeCodesPerSecond = double(pv.value());
    } else if (auto pvd = var.get_value<double>()) {
      DCOUT("metersPerUnit = " << pvd.value());
      _stage_metas.timeCodesPerSecond = pvd.value();
    } else {
      PUSH_ERROR_AND_RETURN(
          "`timeCodesPerSecond` isn't a floating-point value.");
    }
  } else if (varname == "startTimeCode") {
    if (auto pv = var.get_value<float>()) {
      DCOUT("startTimeCode = " << pv.value());
      _stage_metas.startTimeCode = double(pv.value());
    } else if (auto pvd = var.get_value<double>()) {
      DCOUT("startTimeCode = " << pvd.value());
      _stage_metas.startTimeCode = pvd.value();
    }
  } else if (varname == "endTimeCode") {
    if (auto pv = var.get_value<float>()) {
      DCOUT("endTimeCode = " << pv.value());
      _stage_metas.endTimeCode = double(pv.value());
    } else if (auto pvd = var.get_value<double>()) {
      DCOUT("endTimeCode = " << pvd.value());
      _stage_metas.endTimeCode = pvd.value();
    }
  } else if (varname == "framesPerSecond") {
    if (auto pv = var.get_value<float>()) {
      DCOUT("framesPerSecond = " << pv.value());
      _stage_metas.framesPerSecond = double(pv.value());
    } else if (auto pvd = var.get_value<double>()) {
      DCOUT("framesPerSecond = " << pvd.value());
      _stage_metas.framesPerSecond = pvd.value();
    }
  } else if (varname == "apiSchemas") {
    // TODO: ListEdit qualifer check
    if (auto pv = var.get_value<std::vector<value::token>>()) {
      for (auto &item : pv.value()) {
        if (IsSupportedAPISchema(item.str())) {
          // OK
        } else {
          PUSH_ERROR_AND_RETURN("\"" << item.str()
                                     << "\" is not supported(at the moment) "
                                        "for `apiSchemas` in TinyUSDZ.");
        }
      }
    } else {
      PUSH_ERROR_AND_RETURN("`apiSchemas` isn't an `token[]` type.");
    }
  } else if (varname == "customLayerData") {
    if (auto pv = var.get_value<Dictionary>()) {
      _stage_metas.customLayerData = pv.value();
    } else {
      PUSH_ERROR_AND_RETURN("`customLayerData` isn't a dictionary value.");
    }
  } else if (varname == "comment") {
    if (auto pv = var.get_value<value::StringData>()) {
      DCOUT("comment = " << to_string(pv.value()));
      _stage_metas.comment = pv.value();
    } else if (auto pvs = var.get_value<std::string>()) {
      value::StringData sdata;
      sdata.value = pvs.value();
      sdata.is_triple_quoted = false;
      _stage_metas.comment = sdata;
    } else {
      PUSH_ERROR_AND_RETURN(fmt::format("`{}` isn't a string value.", varname));
    }
  } else {
    DCOUT("TODO: Stage meta: " << varname);
    PUSH_WARN("TODO: Stage meta: " << varname);
  }

  return true;
}